

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

TShaderStages * __thiscall
Diligent::PipelineStateVkImpl::InitInternalObjects<Diligent::GraphicsPipelineStateCreateInfo>
          (TShaderStages *__return_storage_ptr__,PipelineStateVkImpl *this,
          GraphicsPipelineStateCreateInfo *CreateInfo,
          vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *vkShaderStages,
          vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
          *ShaderModules)

{
  IMemoryAllocator *Allocator;
  RenderDeviceVkImpl *this_00;
  VulkanLogicalDevice *LogicalDevice_00;
  VulkanLogicalDevice *LogicalDevice;
  FixedLinearAllocator MemPool;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  *ShaderModules_local;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  *vkShaderStages_local;
  GraphicsPipelineStateCreateInfo *CreateInfo_local;
  PipelineStateVkImpl *this_local;
  TShaderStages *ShaderStages;
  
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::vector(__return_storage_ptr__);
  PipelineStateBase<Diligent::EngineVkImplTraits>::
  ExtractShaders<Diligent::ShaderVkImpl,Diligent::GraphicsPipelineStateCreateInfo,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,CreateInfo,
             __return_storage_ptr__,true);
  Allocator = GetRawAllocator();
  FixedLinearAllocator::FixedLinearAllocator((FixedLinearAllocator *)&LogicalDevice,Allocator);
  PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveSpaceForPipelineDesc
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,CreateInfo,
             (FixedLinearAllocator *)&LogicalDevice);
  FixedLinearAllocator::Reserve((FixedLinearAllocator *)&LogicalDevice);
  this_00 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         *)this);
  LogicalDevice_00 = RenderDeviceVkImpl::GetLogicalDevice(this_00);
  PipelineStateBase<Diligent::EngineVkImplTraits>::InitializePipelineDesc
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,CreateInfo,
             (FixedLinearAllocator *)&LogicalDevice);
  InitPipelineLayout(this,&CreateInfo->super_PipelineStateCreateInfo,__return_storage_ptr__);
  anon_unknown_227::InitPipelineShaderStages
            (LogicalDevice_00,__return_storage_ptr__,ShaderModules,vkShaderStages);
  FixedLinearAllocator::~FixedLinearAllocator((FixedLinearAllocator *)&LogicalDevice);
  return __return_storage_ptr__;
}

Assistant:

PipelineStateVkImpl::TShaderStages PipelineStateVkImpl::InitInternalObjects(
    const PSOCreateInfoType&                           CreateInfo,
    std::vector<VkPipelineShaderStageCreateInfo>&      vkShaderStages,
    std::vector<VulkanUtilities::ShaderModuleWrapper>& ShaderModules) noexcept(false)
{
    TShaderStages ShaderStages;
    ExtractShaders<ShaderVkImpl>(CreateInfo, ShaderStages, /*WaitUntilShadersReady = */ true);

    FixedLinearAllocator MemPool{GetRawAllocator()};

    ReserveSpaceForPipelineDesc(CreateInfo, MemPool);

    MemPool.Reserve();

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();

    InitializePipelineDesc(CreateInfo, MemPool);

    InitPipelineLayout(CreateInfo, ShaderStages);

    // Create shader modules and initialize shader stages
    InitPipelineShaderStages(LogicalDevice, ShaderStages, ShaderModules, vkShaderStages);

    return ShaderStages;
}